

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O1

string * ts2string_abi_cxx11_(string *__return_storage_ptr__,double _zt,int secDecimals)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  char s [100];
  time_t in_stack_ffffffffffffff48;
  long *local_a8;
  long local_98 [2];
  char local_88 [104];
  
  ts2string_abi_cxx11_(in_stack_ffffffffffffff48);
  dVar2 = fmod(_zt,1.0);
  dVar3 = pow(10.0,(double)secDecimals);
  snprintf(local_88,100,"%s.%dZ",local_a8,(ulong)(uint)(int)(dVar3 * dVar2));
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_88);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_88,local_88 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ts2string (double _zt, int secDecimals)
{
    char s[100];
    snprintf(s, sizeof(s), "%s.%dZ",
             ts2string(time_t(_zt)).c_str(),
             int(std::fmod(_zt, 1.0f) * std::pow(10.0,secDecimals)) );
    return std::string(s);
}